

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O3

int64 __thiscall Bstrlib::String::parseInt(String *this,int base,int *endPos)

{
  uchar uVar1;
  byte bVar2;
  uchar uVar3;
  uchar *puVar4;
  char *pcVar5;
  long lVar6;
  int iVar7;
  uchar *puVar8;
  long lVar9;
  uchar *puVar10;
  int iVar11;
  char BASEText [17];
  char baseText [17];
  char local_68 [32];
  char local_48 [24];
  
  if ((this->super_tagbstring).slen == 0) {
    if (endPos != (int *)0x0) {
      *endPos = 0;
    }
    return 0;
  }
  puVar4 = (this->super_tagbstring).data;
  uVar1 = *puVar4;
  puVar8 = puVar4 + (uVar1 == '-');
  builtin_strncpy(local_48,"0123456789abcdef",0x11);
  builtin_strncpy(local_68,"0123456789ABCDEF",0x11);
  puVar10 = puVar8;
  if ((base != 0) || (base = 10, *puVar8 != '0')) goto LAB_0010b673;
  puVar10 = puVar8 + 1;
  bVar2 = puVar8[1];
  base = 8;
  if (bVar2 < 0x62) {
    if (bVar2 == 0x42) {
LAB_0010b667:
      puVar10 = puVar8 + 2;
      base = 2;
      goto LAB_0010b673;
    }
    if (bVar2 != 0x58) goto LAB_0010b673;
  }
  else {
    if (bVar2 == 0x62) goto LAB_0010b667;
    if (bVar2 != 0x78) goto LAB_0010b673;
  }
  puVar10 = puVar8 + 2;
  base = 0x10;
LAB_0010b673:
  iVar11 = (int)puVar10 - (int)puVar4;
  lVar9 = 0;
  while( true ) {
    uVar3 = *puVar10;
    pcVar5 = strchr(local_48,(int)(char)uVar3);
    iVar7 = (int)pcVar5 - (int)local_48;
    if ((10 < base) && (pcVar5 == (char *)0x0)) {
      pcVar5 = strchr(local_68,(int)(char)uVar3);
      iVar7 = (int)pcVar5 - (int)local_68;
    }
    if ((pcVar5 == (char *)0x0) || (base <= iVar7)) break;
    lVar9 = lVar9 * base + (long)iVar7;
    puVar10 = puVar10 + 1;
    iVar11 = iVar11 + 1;
  }
  if (endPos != (int *)0x0) {
    *endPos = iVar11;
  }
  lVar6 = -lVar9;
  if (uVar1 != '-') {
    lVar6 = lVar9;
  }
  return lVar6;
}

Assistant:

int64 String::parseInt(int base, int * endPos) const
    {
        const char * text = (const char*)data;
        if (!slen) { if (endPos) *endPos = 0; return 0; }
        bool negative = text[0] == '-';
        text += (int)negative;
        const char baseText[] = "0123456789abcdef", BASEText[] = "0123456789ABCDEF";

        // Check the current base, if auto detection is activated
        if (!base)
        {
            if (text[0] != '0') base = 10;
            else switch(text[1])
            {
            case 'X': case 'x': base = 16; text += 2; break;
            case 'B': case 'b': base = 2; text += 2; break;
            default: base = 8; text += 1; break;
            }
        }
        // Let's start conversion
        int64 ret = 0;
        while (text)
        {
            const char * charPos = strchr(baseText, *text);
            int digit = (int)(charPos - baseText);
            if (charPos == NULL && base > 10) { charPos = strchr(BASEText, *text); digit = (int)(charPos - BASEText); }
            if (charPos == NULL) break;
            if (digit >= base) break;
            ret = ret * base + digit;
            text++;
        }
        if (endPos) *endPos = (int)(text - (const char*)data);
        return negative ? -ret : ret;
    }